

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O2

void Fraig_Dfs_rec(Fraig_Man_t *pMan,Fraig_Node_t *pNode,Fraig_NodeVec_t *vNodes,int fEquiv)

{
  int iVar1;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Fraig_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fraig/fraigUtil.c"
                  ,0x7c,"void Fraig_Dfs_rec(Fraig_Man_t *, Fraig_Node_t *, Fraig_NodeVec_t *, int)")
    ;
  }
  if (pNode->TravId == pMan->nTravIds) {
    return;
  }
  pNode->TravId = pMan->nTravIds;
  iVar1 = Fraig_NodeIsAnd(pNode);
  if (iVar1 != 0) {
    Fraig_Dfs_rec(pMan,(Fraig_Node_t *)((ulong)pNode->p1 & 0xfffffffffffffffe),vNodes,fEquiv);
    Fraig_Dfs_rec(pMan,(Fraig_Node_t *)((ulong)pNode->p2 & 0xfffffffffffffffe),vNodes,fEquiv);
  }
  if ((fEquiv != 0) && (pNode->pNextE != (Fraig_Node_t *)0x0)) {
    Fraig_Dfs_rec(pMan,pNode->pNextE,vNodes,fEquiv);
  }
  Fraig_NodeVecPush(vNodes,pNode);
  return;
}

Assistant:

void Fraig_Dfs_rec( Fraig_Man_t * pMan, Fraig_Node_t * pNode, Fraig_NodeVec_t * vNodes, int fEquiv )
{
    assert( !Fraig_IsComplement(pNode) );
    // skip the visited node
    if ( pNode->TravId == pMan->nTravIds )
        return;
    pNode->TravId = pMan->nTravIds;
    // visit the transitive fanin
    if ( Fraig_NodeIsAnd(pNode) )
    {
        Fraig_Dfs_rec( pMan, Fraig_Regular(pNode->p1), vNodes, fEquiv );
        Fraig_Dfs_rec( pMan, Fraig_Regular(pNode->p2), vNodes, fEquiv );
    }
    if ( fEquiv && pNode->pNextE )
        Fraig_Dfs_rec( pMan, pNode->pNextE, vNodes, fEquiv );
    // save the node
    Fraig_NodeVecPush( vNodes, pNode );
}